

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

void __thiscall
node::anon_unknown_2::RpcHandlerImpl::RpcHandlerImpl(RpcHandlerImpl *this,CRPCCommand *command)

{
  long lVar1;
  CRPCCommand *in_RSI;
  CRPCCommand *in_RDI;
  long in_FS_OFFSET;
  Handler *in_stack_ffffffffffffffa8;
  string *in_stack_ffffffffffffffb0;
  size_type *this_00;
  CRPCCommand *pcmd;
  CRPCCommand *this_01;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  interfaces::Handler::Handler(in_stack_ffffffffffffffa8);
  (in_RDI->category)._M_dataplus._M_p = (pointer)&PTR__RpcHandlerImpl_01611ff0;
  pcmd = (CRPCCommand *)&(in_RDI->category)._M_string_length;
  CRPCCommand::CRPCCommand(this_01,in_RSI);
  in_RDI[1].category._M_string_length = (size_type)in_RSI;
  this_00 = &(in_RDI->category)._M_string_length;
  std::function<bool(JSONRPCRequest_const&,UniValue&,bool)>::operator=
            ((function<bool_(const_JSONRPCRequest_&,_UniValue_&,_bool)> *)this_00,
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffffb0);
  CRPCTable::appendCommand((CRPCTable *)this_00,in_stack_ffffffffffffffb0,pcmd);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit RpcHandlerImpl(const CRPCCommand& command) : m_command(command), m_wrapped_command(&command)
    {
        m_command.actor = [this](const JSONRPCRequest& request, UniValue& result, bool last_handler) {
            if (!m_wrapped_command) return false;
            try {
                return m_wrapped_command->actor(request, result, last_handler);
            } catch (const UniValue& e) {
                // If this is not the last handler and a wallet not found
                // exception was thrown, return false so the next handler can
                // try to handle the request. Otherwise, reraise the exception.
                if (!last_handler) {
                    const UniValue& code = e["code"];
                    if (code.isNum() && code.getInt<int>() == RPC_WALLET_NOT_FOUND) {
                        return false;
                    }
                }
                throw;
            }
        };
        ::tableRPC.appendCommand(m_command.name, &m_command);
    }